

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseTable
          (MessageGenerator *this,Printer *printer,size_t offset,size_t aux_offset)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined1 local_a0 [8];
  Iterator __end3;
  size_t offset_local;
  size_t aux_offset_local;
  Formatter format;
  Iterator __begin3;
  int max_field_number;
  
  __end3.descriptor = (Descriptor *)offset;
  offset_local = aux_offset;
  aux_offset_local = (size_t)printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  bVar1 = this->table_driven_;
  if (bVar1 == false) {
    Formatter::operator()<>
              ((Formatter *)&aux_offset_local,
               "{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
  }
  else {
    __begin3.descriptor._4_4_ = 0;
    __end3._0_8_ = this->descriptor_;
    format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
    local_a0._0_4_ = *(undefined4 *)(__end3._0_8_ + 0x68);
    iVar4 = 0;
    __begin3._0_8_ = __end3._0_8_;
    while( true ) {
      bVar3 = operator!=((Iterator *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (Iterator *)local_a0);
      if (!bVar3) break;
      iVar2 = *(int *)(*(long *)(__begin3._0_8_ + 0x28) + 0x44 +
                      (long)(int)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count *
                      0x98);
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
        __begin3.descriptor._4_4_ = iVar2;
      }
      format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    Formatter::operator()<>((Formatter *)&aux_offset_local,"{\n");
    google::protobuf::io::Printer::Indent();
    Formatter::operator()
              ((Formatter *)&aux_offset_local,
               "$tablename$::entries + $1$,\n$tablename$::aux + $2$,\n$3$,\n",
               (unsigned_long *)&__end3.descriptor,&offset_local,
               (int *)((long)&__begin3.descriptor + 4));
    pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n";
    if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar5 = "-1,\n";
    }
    Formatter::operator()<>((Formatter *)&aux_offset_local,pcVar5);
    pcVar5 = "-1,  // no _oneof_case_\n";
    if (0 < *(int *)(this->descriptor_ + 0x70)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n";
    }
    Formatter::operator()<>((Formatter *)&aux_offset_local,pcVar5);
    pcVar5 = "-1,  // no _extensions_\n";
    if (0 < *(int *)(this->descriptor_ + 0x7c)) {
      pcVar5 = "PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n";
    }
    Formatter::operator()<>((Formatter *)&aux_offset_local,pcVar5);
    Formatter::operator()<>
              ((Formatter *)&aux_offset_local,
               "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n&$package_ns$::_$classname$_default_instance_,\n"
              );
    bVar3 = UseUnknownFieldSet(*(FileDescriptor **)(this->descriptor_ + 0x10),&this->options_);
    pcVar5 = "false,\n";
    if (bVar3) {
      pcVar5 = "true,\n";
    }
    Formatter::operator()<>((Formatter *)&aux_offset_local,pcVar5);
    google::protobuf::io::Printer::Outdent();
    Formatter::operator()<>((Formatter *)&aux_offset_local,"},\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return bVar1;
}

Assistant:

bool MessageGenerator::GenerateParseTable(io::Printer* printer, size_t offset,
                                          size_t aux_offset) {
  Formatter format(printer, variables_);

  if (!table_driven_) {
    format("{ nullptr, nullptr, 0, -1, -1, -1, -1, nullptr, false },\n");
    return false;
  }

  int max_field_number = 0;
  for (auto field : FieldRange(descriptor_)) {
    if (max_field_number < field->number()) {
      max_field_number = field->number();
    }
  }

  format("{\n");
  format.Indent();

  format(
      "$tablename$::entries + $1$,\n"
      "$tablename$::aux + $2$,\n"
      "$3$,\n",
      offset, aux_offset, max_field_number);

  if (has_bit_indices_.empty()) {
    // If no fields have hasbits, then _has_bits_ does not exist.
    format("-1,\n");
  } else {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_),\n");
  }

  if (descriptor_->real_oneof_decl_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_),\n");
  } else {
    format("-1,  // no _oneof_case_\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    format("PROTOBUF_FIELD_OFFSET($classtype$, _extensions_),\n");
  } else {
    format("-1,  // no _extensions_\n");
  }

  // TODO(ckennelly): Consolidate this with the calculation for
  // AuxillaryParseTableField.
  format(
      "PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_),\n"
      "&$package_ns$::_$classname$_default_instance_,\n");

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    format("true,\n");
  } else {
    format("false,\n");
  }

  format.Outdent();
  format("},\n");
  return true;
}